

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputToFont.cpp
# Opt level: O0

bool __thiscall
GrcManager::AddFeatsModFamilyAux
          (GrcManager *this,uint8 *pTblOld,size_t param_3,uint8 *pTblNew,size_t param_5,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *vstuExtNames,vector<unsigned_short,_std::allocator<unsigned_short>_> *vnLangIds,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vnNameTblIds,
          uint16 *pchwFamilyName,size_t cchwFamilyName,
          vector<PlatEncChange,_std::allocator<PlatEncChange>_> *vpec,size_t nNameTblMinNew)

{
  ushort uVar1;
  size_type sVar2;
  undefined2 *puVar3;
  bool bVar4;
  uint16 uVar5;
  uint16 uVar6;
  uint16 uVar7;
  uint16 uVar8;
  short sVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  unsigned_short uVar12;
  size_type_conflict sVar13;
  size_type_conflict sVar14;
  reference pvVar15;
  reference pvVar16;
  wchar_t *__last;
  uint uVar17;
  undefined2 *in_RCX;
  undefined2 *in_RSI;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *in_R9;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_00000008;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_00000010;
  char16_t *in_stack_00000018;
  size_type in_stack_00000020;
  vector<PlatEncChange,_std::allocator<PlatEncChange>_> *in_stack_00000028;
  wstring stuWchar;
  uint16 language_id;
  uint16 specific_id;
  uint16 platform_id;
  uint16 cbStr_1;
  size_t istring;
  bool f8bit;
  PlatEncChange *ppec_1;
  bool fStringsStored16;
  bool fStringsStored8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vdibOffsets16;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vdibOffsets8;
  uint16 nameID;
  uint8 *pbStr;
  uint16 cbStr;
  size_t cchwStr;
  PlatEncChange *ppec;
  int irec;
  int ipec;
  utf16 rgch16 [512];
  uint16 dibNew;
  uint8 *pbNextString;
  uint16 ibStrOffsetNew;
  NameRecord *pNewRecord;
  uint16 crecNew;
  NameRecord *pOldRecord;
  uint16 ibStrOffsetOld;
  uint16 crecOld;
  FontNames *pTbl;
  uint16 local_6c6;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
  *in_stack_fffffffffffff940;
  wstring *__result;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffff950;
  allocator *in_stack_fffffffffffff958;
  allocator *in_stack_fffffffffffff960;
  allocator *in_stack_fffffffffffff968;
  allocator *in_stack_fffffffffffff970;
  undefined2 in_stack_fffffffffffff978;
  ulong uVar18;
  int __val;
  undefined4 in_stack_fffffffffffff990;
  int iVar19;
  wstring local_610 [39];
  allocator local_5e9;
  string local_5e8 [32];
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [32];
  string local_558 [39];
  allocator local_531;
  string local_530 [36];
  unsigned_short local_50c;
  unsigned_short local_50a;
  unsigned_short local_508;
  ushort local_506;
  ulong local_4f8;
  byte local_4e9;
  reference local_4e8;
  byte local_4da;
  byte local_4d9;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_4d8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_4c0;
  uint16 local_4a2;
  char16_t *local_4a0;
  ushort local_492;
  size_type local_490;
  reference local_488;
  int local_480;
  int local_47c;
  undefined1 local_478 [1038];
  short local_6a;
  void *local_68;
  ushort local_5a;
  undefined2 *local_58;
  ushort local_4a;
  undefined2 *local_48;
  uint16 local_3c;
  uint16 local_3a;
  undefined2 *local_38;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *local_30;
  undefined2 *local_20;
  undefined2 *local_10;
  
  local_38 = in_RSI;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_3a = TtfUtil::read<unsigned_short>(0);
  local_3c = TtfUtil::read<unsigned_short>(0);
  uVar5 = local_3a;
  local_48 = local_38 + 3;
  sVar13 = std::
           vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::size(local_30);
  sVar14 = std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::size(in_stack_00000028);
  local_4a = uVar5 + (short)sVar13 * (short)sVar14;
  *local_20 = *local_38;
  uVar5 = TtfUtil::read<unsigned_short>(0);
  local_20[1] = uVar5;
  local_5a = (local_4a - 1) * 0xc + 0x12;
  uVar5 = TtfUtil::read<unsigned_short>(0);
  local_20[2] = uVar5;
  local_58 = local_20 + 3;
  local_68 = (void *)((long)local_20 + (long)(int)(uint)local_5a);
  local_6a = 0;
  local_47c = 0;
  for (local_480 = 0; local_480 < (int)(uint)local_3a; local_480 = local_480 + 1) {
    local_488 = std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::operator[]
                          (in_stack_00000028,(long)local_47c);
    while( true ) {
      iVar19 = local_47c;
      sVar13 = std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::size(in_stack_00000028);
      bVar4 = false;
      if (iVar19 < (int)sVar13) {
        uVar1 = local_488->platformID;
        uVar5 = TtfUtil::read<unsigned_short>(0);
        bVar4 = true;
        if (uVar5 <= uVar1) {
          uVar5 = local_488->platformID;
          uVar6 = TtfUtil::read<unsigned_short>(0);
          bVar4 = false;
          if (uVar5 == uVar6) {
            uVar1 = local_488->encodingID;
            uVar5 = TtfUtil::read<unsigned_short>(0);
            bVar4 = uVar1 < uVar5;
          }
        }
      }
      iVar19 = local_47c;
      if (!bVar4) break;
      local_47c = local_47c + 1;
      local_488 = std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::operator[]
                            (in_stack_00000028,(long)local_47c);
    }
    local_58[(long)local_480 * 6] = local_48[(long)local_480 * 6];
    local_58[(long)local_480 * 6 + 1] = local_48[(long)local_480 * 6 + 1];
    local_58[(long)local_480 * 6 + 2] = local_48[(long)local_480 * 6 + 2];
    local_58[(long)local_480 * 6 + 3] = local_48[(long)local_480 * 6 + 3];
    local_58[(long)local_480 * 6 + 4] = local_48[(long)local_480 * 6 + 4];
    local_490 = 0;
    local_492 = 0;
    local_4a0 = (char16_t *)0x0;
    sVar13 = std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::size(in_stack_00000028);
    if ((((iVar19 < (int)sVar13) &&
         (bVar4 = std::__cxx11::
                  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                  empty((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                         *)0x24ca1e), !bVar4)) &&
        (uVar5 = local_488->platformID, uVar6 = TtfUtil::read<unsigned_short>(0), uVar5 == uVar6))
       && ((uVar5 = local_488->encodingID, uVar6 = TtfUtil::read<unsigned_short>(0), uVar5 == uVar6
           && (uVar5 = local_488->engLangID, uVar6 = TtfUtil::read<unsigned_short>(0),
              uVar5 == uVar6)))) {
      local_4a2 = TtfUtil::read<unsigned_short>(0);
      switch(local_4a2) {
      case 1:
      case 0xf:
        local_4a0 = in_stack_00000018;
        local_490 = in_stack_00000020;
        break;
      default:
        break;
      case 3:
        std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::operator[]
                  (in_stack_00000028,(long)local_47c);
        local_4a0 = std::__cxx11::
                    basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                    data(in_stack_fffffffffffff940);
        pvVar15 = std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::operator[]
                            (in_stack_00000028,(long)local_47c);
        local_490 = std::__cxx11::
                    basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                    length(&pvVar15->stuUniqueName);
        break;
      case 4:
      case 0x11:
        std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::operator[]
                  (in_stack_00000028,(long)local_47c);
        local_4a0 = std::__cxx11::
                    basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                    data(in_stack_fffffffffffff940);
        pvVar15 = std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::operator[]
                            (in_stack_00000028,(long)local_47c);
        local_490 = std::__cxx11::
                    basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                    length(&pvVar15->stuFullName);
        break;
      case 6:
        std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::operator[]
                  (in_stack_00000028,(long)local_47c);
        local_4a0 = std::__cxx11::
                    basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                    data(in_stack_fffffffffffff940);
        pvVar15 = std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::operator[]
                            (in_stack_00000028,(long)local_47c);
        local_490 = std::__cxx11::
                    basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                    length(&pvVar15->stuPostscriptName);
      }
    }
    sVar2 = local_490;
    if (local_4a0 == (char16_t *)0x0) {
      local_492 = TtfUtil::read<unsigned_short>(0);
      puVar3 = local_10;
      uVar17 = (uint)local_3c;
      uVar5 = TtfUtil::read<unsigned_short>(0);
      local_4a0 = (char16_t *)((long)puVar3 + (long)(int)(uint)uVar5 + (long)(int)uVar17);
      memcpy(local_68,local_4a0,(ulong)local_492);
    }
    else {
      pvVar15 = std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::operator[]
                          (in_stack_00000028,(long)local_47c);
      local_492 = (short)sVar2 * (short)pvVar15->cbBytesPerChar;
      uVar5 = TtfUtil::read<unsigned_short>(0);
      local_58[(long)local_480 * 6 + 4] = uVar5;
      if (local_488->cbBytesPerChar == 2) {
        memcpy(local_68,local_4a0,(ulong)local_492);
        TtfUtil::SwapWString(in_stack_fffffffffffff970,(size_t)in_stack_fffffffffffff968);
      }
      else {
        gr::Platform_UnicodeToANSI
                  ((utf16 *)in_stack_fffffffffffff968,(size_t)in_stack_fffffffffffff960,
                   (char *)in_stack_fffffffffffff958,(size_t)in_stack_fffffffffffff950);
      }
    }
    uVar5 = TtfUtil::read<unsigned_short>(0);
    local_58[(long)local_480 * 6 + 5] = uVar5;
    local_6a = local_6a + local_492;
    local_68 = (void *)((long)local_68 + (long)(int)(uint)local_492);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x24ce78);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x24ce85);
  local_4d9 = 0;
  local_4da = 0;
  local_47c = 0;
  while (iVar19 = local_47c,
        sVar13 = std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::size(in_stack_00000028)
        , iVar19 < (int)sVar13) {
    local_4e8 = std::vector<PlatEncChange,_std::allocator<PlatEncChange>_>::operator[]
                          (in_stack_00000028,(long)local_47c);
    local_4e9 = local_4e8->cbBytesPerChar != 2;
    local_4f8 = 0;
    while (uVar18 = local_4f8,
          sVar13 = std::
                   vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   ::size(local_30), uVar18 < sVar13) {
      uVar5 = TtfUtil::read<unsigned_short>(0);
      __val = (int)(uVar18 >> 0x20);
      local_58[(long)local_480 * 6] = uVar5;
      uVar6 = TtfUtil::read<unsigned_short>(0);
      local_58[(long)local_480 * 6 + 1] = uVar6;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                (in_stack_00000008,local_4f8);
      uVar7 = TtfUtil::read<unsigned_short>(0);
      local_58[(long)local_480 * 6 + 2] = uVar7;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                (in_stack_00000010,local_4f8);
      uVar8 = TtfUtil::read<unsigned_short>(0);
      local_58[(long)local_480 * 6 + 3] = uVar8;
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator[](local_30,local_4f8);
      sVar9 = std::__cxx11::wstring::length();
      local_506 = sVar9 * (short)(int)local_4e8->cbBytesPerChar;
      local_508 = local_58[(long)local_480 * 6];
      local_50a = local_58[(long)local_480 * 6 + 1];
      local_50c = local_58[(long)local_480 * 6 + 2];
      uVar10 = TtfUtil::rev16<unsigned_short>(local_508);
      local_508 = uVar10;
      uVar11 = TtfUtil::rev16<unsigned_short>(local_50a);
      local_50a = uVar11;
      uVar12 = TtfUtil::rev16<unsigned_short>(local_50c);
      local_50c = uVar12;
      if ((local_508 == 1) && (local_50a == 0)) {
        if (uVar12 != 0x409) {
          in_stack_fffffffffffff970 = &local_531;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_530,"Windows language ID ",in_stack_fffffffffffff970);
          std::__cxx11::to_string(__val);
          in_stack_fffffffffffff968 = &local_579;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_578," cannot be converted to Macintosh; 0 (English) will be used",
                     in_stack_fffffffffffff968);
          GrcErrorList::AddWarning
                    ((GrcErrorList *)CONCAT44(iVar19,in_stack_fffffffffffff990),__val,
                     (GdlObject *)CONCAT26(uVar5,CONCAT24(uVar6,CONCAT22(uVar7,uVar8))),
                     (string *)
                     CONCAT26(uVar10,CONCAT24(uVar11,CONCAT22(uVar12,in_stack_fffffffffffff978))),
                     (string *)in_stack_fffffffffffff970,(string *)in_stack_fffffffffffff968);
          std::__cxx11::string::~string(local_578);
          std::allocator<char>::~allocator((allocator<char> *)&local_579);
          std::__cxx11::string::~string(local_558);
          std::__cxx11::string::~string(local_530);
          std::allocator<char>::~allocator((allocator<char> *)&local_531);
        }
        local_58[(long)local_480 * 6 + 2] = 0;
      }
      else if ((local_508 == 0) && (local_50a == 3)) {
        if (uVar12 != 0x409) {
          in_stack_fffffffffffff960 = &local_5a1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_5a0,"Windows language ID ",in_stack_fffffffffffff960);
          std::__cxx11::to_string(__val);
          in_stack_fffffffffffff958 = &local_5e9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_5e8," cannot be translated to Unicode 2.0; language 0 will be used",
                     in_stack_fffffffffffff958);
          GrcErrorList::AddWarning
                    ((GrcErrorList *)CONCAT44(iVar19,in_stack_fffffffffffff990),__val,
                     (GdlObject *)CONCAT26(uVar5,CONCAT24(uVar6,CONCAT22(uVar7,uVar8))),
                     (string *)
                     CONCAT26(uVar10,CONCAT24(uVar11,CONCAT22(uVar12,in_stack_fffffffffffff978))),
                     (string *)in_stack_fffffffffffff970,(string *)in_stack_fffffffffffff968);
          std::__cxx11::string::~string(local_5e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
          std::__cxx11::string::~string(local_5c8);
          std::__cxx11::string::~string(local_5a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
        }
        local_58[(long)local_480 * 6 + 2] = 0;
      }
      pvVar16 = std::
                vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                ::operator[](local_30,local_4f8);
      std::__cxx11::wstring::wstring(local_610,(wstring *)pvVar16);
      __result = local_610;
      __last = (wchar_t *)std::__cxx11::wstring::data();
      in_stack_fffffffffffff950 =
           (vector<unsigned_short,_std::allocator<unsigned_short>_> *)std::__cxx11::wstring::data();
      std::__cxx11::wstring::length();
      std::copy<wchar_t_const*,unsigned_short*>
                ((wchar_t *)in_stack_fffffffffffff950,__last,(unsigned_short *)__result);
      if (((local_4e9 & 1) == 0) || ((local_4d9 & 1) != 0)) {
        if (((local_4e9 & 1) == 0) && ((local_4da & 1) == 0)) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (in_stack_fffffffffffff950,(value_type_conflict2 *)__last);
          memcpy(local_68,local_478,(ulong)local_506);
          TtfUtil::SwapWString(in_stack_fffffffffffff970,(size_t)in_stack_fffffffffffff968);
          local_6a = local_6a + local_506;
          local_68 = (void *)((long)local_68 + (long)(int)(uint)local_506);
        }
      }
      else {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (in_stack_fffffffffffff950,(value_type_conflict2 *)__last);
        gr::Platform_UnicodeToANSI
                  ((utf16 *)in_stack_fffffffffffff968,(size_t)in_stack_fffffffffffff960,
                   (char *)in_stack_fffffffffffff958,(size_t)in_stack_fffffffffffff950);
        local_6a = local_6a + local_506;
        local_68 = (void *)((long)local_68 + (long)(int)(uint)local_506);
      }
      uVar5 = TtfUtil::read<unsigned_short>(0);
      local_58[(long)local_480 * 6 + 4] = uVar5;
      if ((local_4e9 & 1) == 0) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  (&local_4d8,local_4f8);
        local_6c6 = TtfUtil::read<unsigned_short>(0);
      }
      else {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  (&local_4c0,local_4f8);
        local_6c6 = TtfUtil::read<unsigned_short>(0);
      }
      local_58[(long)local_480 * 6 + 5] = local_6c6;
      local_480 = local_480 + 1;
      std::__cxx11::wstring::~wstring(local_610);
      local_4f8 = local_4f8 + 1;
    }
    if ((local_4e9 & 1) == 0) {
      local_4da = 1;
    }
    else {
      local_4d9 = 1;
    }
    local_47c = local_47c + 1;
  }
  qsort(local_58,(ulong)local_4a,0xc,AddFeatsModFamilyAux::NameTblEntry::Compare);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(in_stack_fffffffffffff950);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(in_stack_fffffffffffff950);
  return true;
}

Assistant:

bool GrcManager::AddFeatsModFamilyAux(uint8 * pTblOld, size_t /*cbTblOld*/, 
	uint8 * pTblNew, size_t /*cbTblNew*/,
	std::vector<std::wstring> & vstuExtNames, std::vector<uint16> & vnLangIds,
	std::vector<uint16> & vnNameTblIds, 
	uint16 * pchwFamilyName, size_t cchwFamilyName, std::vector<PlatEncChange> & vpec,
	size_t nNameTblMinNew)
{
    #pragma pack(1)
	// Struct used to store data from directory entries that need to be sorted.
	// Must match the NameRecord struct exactly.
	struct NameTblEntry
	{
		uint16 nPlatId;
		uint16 nEncId;
		uint16 nLangId;
		uint16 nNameId;
		uint16 cLength;
		uint16 ibOffset;
		static int Compare(const void * ptr1, const void * ptr2)
		{
			NameTblEntry * p1 = (NameTblEntry *) ptr1;
			NameTblEntry * p2 = (NameTblEntry *) ptr2;

			if (p1->nPlatId != p2->nPlatId)
				return read(p1->nPlatId) - read(p2->nPlatId);
			else if (p1->nEncId != p2->nEncId)
				return read(p1->nEncId) - read(p2->nEncId);
			else if (p1->nLangId != p2->nLangId)
				return read(p1->nLangId) - read(p2->nLangId);
			else
				return read(p1->nNameId) - read(p2->nNameId);
		}
	};

	FontNames * pTbl = (FontNames *)(pTblOld);
	uint16 crecOld = read(pTbl->count);
	uint16 ibStrOffsetOld = read(pTbl->string_offset);
	NameRecord * pOldRecord = pTbl->name_record;

	uint16 crecNew = (uint16)(crecOld + (int)(vstuExtNames.size() * vpec.size()));

	NameRecord * pNewRecord;

	// name table header
	((FontNames *)pTblNew)->format = pTbl->format;
	((FontNames *)pTblNew)->count = read(crecNew);
	uint16 ibStrOffsetNew = sizeof(FontNames) + (crecNew - 1) * sizeof(NameRecord);
	((FontNames *)pTblNew)->string_offset = read(ibStrOffsetNew);

    pNewRecord = ((FontNames *)pTblNew)->name_record;

	uint8 * pbNextString = pTblNew + ibStrOffsetNew;
	uint16 dibNew = 0; // delta offset

	utf16 rgch16[512];	// buffer for converting between wchar_t and utf16;

	// First copy the old records, changing any font names as needed.

	int ipec;

#ifndef NDEBUG
	for (ipec = 0; ipec < signed(vpec.size()) - 1; ipec++)
	{
		Assert((vpec[ipec].platformID < vpec[ipec + 1].platformID)
				|| (vpec[ipec].platformID == vpec[ipec + 1].platformID
					&& (vpec[ipec].encodingID < vpec[ipec + 1].encodingID ||
					    (vpec[ipec].encodingID == vpec[ipec + 1].encodingID &&
					     vpec[ipec].engLangID < vpec[ipec+1].engLangID))));
	}
#endif

	ipec = 0;
	int irec = 0; // scope of this variable is larger than for-loop below.
	for ( ; irec < crecOld; irec++)
	{
		PlatEncChange * ppec = &(vpec[ipec]);
		while(ipec < signed(vpec.size())
			&& (ppec->platformID < read(pOldRecord[irec].platform_id)
				|| (ppec->platformID == read(pOldRecord[irec].platform_id)
					&& ppec->encodingID < read(pOldRecord[irec].platform_specific_id))))
		{
			ipec++;
			ppec = &(vpec[ipec]);
		}

		pNewRecord[irec].platform_id = pOldRecord[irec].platform_id;
		pNewRecord[irec].platform_specific_id = pOldRecord[irec].platform_specific_id;
		pNewRecord[irec].language_id = pOldRecord[irec].language_id;
		pNewRecord[irec].name_id = pOldRecord[irec].name_id;
		pNewRecord[irec].length = pOldRecord[irec].length;
		//pNewRecord[irec].offset = ibStrOffsetNew + dibNew;

		size_t cchwStr = 0;
        uint16 cbStr = 0;
		uint8 * pbStr = NULL;
		if (ipec < signed(vpec.size())
			&& !ppec->stuFullName.empty() // this is a platform+encoding where we need to change the font
			&& ppec->platformID == read(pOldRecord[irec].platform_id)
			&& ppec->encodingID == read(pOldRecord[irec].platform_specific_id)
			&& ppec->engLangID == read(pOldRecord[irec].language_id))
		{
			uint16 nameID = read(pOldRecord[irec].name_id);
			switch (nameID)
			{
			case n_family:
			case n_preferredfamily:
				pbStr = (uint8 *)pchwFamilyName;
				cchwStr = cchwFamilyName;
				break;
			case n_fullname:
			case n_compatiblefull:
				pbStr = (uint8 *)vpec[ipec].stuFullName.data();
				cchwStr = vpec[ipec].stuFullName.length();
				break;
			case n_uniquename:
				pbStr = (uint8 *)vpec[ipec].stuUniqueName.data();
				cchwStr = vpec[ipec].stuUniqueName.length();
				break;
			case n_postscript:
				pbStr = (uint8 *)vpec[ipec].stuPostscriptName.data();
				cchwStr = vpec[ipec].stuPostscriptName.length();
				break;
			default:
				break;
			}
		}
		if (pbStr)
		{
			// Copy in the new string.
			cbStr = (uint16)(cchwStr * (vpec[ipec].cbBytesPerChar));
			pNewRecord[irec].length = read(cbStr);
			if (ppec->cbBytesPerChar == sizeof(utf16))
			{
				memcpy(pbNextString, pbStr, cbStr);
				TtfUtil::SwapWString(pbNextString, cbStr / sizeof(utf16)); // make big endian
			}
			else
			{
				// TODO: properly handle Macintosh encoding
				Platform_UnicodeToANSI((utf16 *)pbStr, cchwStr, (char *)pbNextString, cchwStr);
			}
		}
		else
		{
			// Copy the old string.
			cbStr = read(pOldRecord[irec].length);
			pbStr = pTblOld + ibStrOffsetOld + read(pOldRecord[irec].offset);
			memcpy(pbNextString, pbStr, cbStr);
		}
		pNewRecord[irec].offset = read(dibNew);
		dibNew += cbStr;
		pbNextString += cbStr;
	}

	// Then add the feature strings. Do this for all platform-encodings of interest.
	// The first time through, store the string data in the buffer and record the offsets
	// (do this once for 8-bit versions and once for 16-bit). For any subsequent platforms
	// and encodings, just use the same offsets.

	std::vector<uint16> vdibOffsets8, vdibOffsets16;
	bool fStringsStored8 = false;
	bool fStringsStored16 = false;
	for (ipec = 0; ipec < signed(vpec.size()); ipec++)
	{
		PlatEncChange * ppec = &(vpec[ipec]);
		bool f8bit = (ppec->cbBytesPerChar != sizeof(utf16));
		for (size_t istring = 0; istring < vstuExtNames.size(); istring++)
		{
			pNewRecord[irec].platform_id = read(ppec->platformID);
			pNewRecord[irec].platform_specific_id = read(ppec->encodingID);
			pNewRecord[irec].language_id = read(vnLangIds[istring]);
			pNewRecord[irec].name_id = read(vnNameTblIds[istring]);
			uint16 cbStr = (uint16)(vstuExtNames[istring].length() * ppec->cbBytesPerChar);

			// Convert the language IDs appropriately for the platform.
			uint16 platform_id = pNewRecord[irec].platform_id;
			uint16 specific_id = pNewRecord[irec].platform_specific_id;
			uint16 language_id = pNewRecord[irec].language_id;
#if !WORDS_BIGENDIAN
			platform_id = rev16(platform_id);
			specific_id = rev16(specific_id);
			language_id = rev16(language_id);
#endif
			if (platform_id == NameRecord::Macintosh && specific_id == 0) // Roman
			{
				// TODO: Convert common Windows language codes to Macintosh
				if (language_id != LG_USENG)
				{
					g_errorList.AddWarning(5506, NULL,
						"Windows language ID ", std::to_string(language_id),
						" cannot be converted to Macintosh; 0 (English) will be used");
				}
				pNewRecord[irec].language_id = 0;	// Macintosh English
			}
			else if (platform_id == 0 && specific_id == 3) // Unicode, >= 2.0
			{
				if (language_id != LG_USENG)
				{
					g_errorList.AddWarning(5507, NULL,
						"Windows language ID ", std::to_string(language_id),
						" cannot be translated to Unicode 2.0; language 0 will be used");
				}
				pNewRecord[irec].language_id = 0;	// whatever, this is our best guess
			}

			// Convert from wchar_t to 16-bit chars.
			std::wstring stuWchar = vstuExtNames[istring];
			std::copy(stuWchar.data(), stuWchar.data() + stuWchar.length(), rgch16);

			if (f8bit && !fStringsStored8)
			{
				vdibOffsets8.push_back(dibNew);
				// TODO: properly handle Macintosh encoding
				Platform_UnicodeToANSI(rgch16, cbStr, (char *)pbNextString, cbStr);
				dibNew += cbStr;
				pbNextString += cbStr;
			}
			else if (!f8bit && !fStringsStored16)
			{
				vdibOffsets16.push_back(dibNew);
				memcpy(pbNextString, rgch16, cbStr);
				TtfUtil::SwapWString(pbNextString, cbStr / sizeof(utf16)); // make big endian
				dibNew += cbStr;
				pbNextString += cbStr;
			}
			// else the string has already been stored, and we've saved the offset.

			pNewRecord[irec].length = read(cbStr);
			pNewRecord[irec].offset = (f8bit) ?
				read(vdibOffsets8[istring]):
				read(vdibOffsets16[istring]);
			irec++;
		}

		(f8bit) ?
			fStringsStored8 = true:
			fStringsStored16 = true;
	}

	Assert(irec == crecNew);

	// Sort list of entries.
	::qsort(reinterpret_cast<NameTblEntry *>(pNewRecord), crecNew, sizeof(NameTblEntry), NameTblEntry::Compare);

	return true;
}